

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZlibWriter.h
# Opt level: O0

uint8_t * __thiscall ZlibWriter::data(ZlibWriter *this)

{
  size_type sVar1;
  ZlibWriter *this_local;
  
  flush(this);
  sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->zbuf);
  if (sVar1 == 0) {
    this_local = (ZlibWriter *)data::empty_byte;
  }
  else {
    this_local = (ZlibWriter *)
                 std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (&this->zbuf,0);
  }
  return (uint8_t *)this_local;
}

Assistant:

inline const uint8_t * data() const
	{
		flush();
		if (zbuf.size() != 0)
		{
			return &zbuf[0];
		}
		else
		{
			static uint8_t empty_byte[1];
			return (const uint8_t *) &empty_byte;
		}
	}